

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)

{
  fdb_kvs_handle *pfVar1;
  fdb_kvs_id_t fVar2;
  hbtrie_iterator *phVar3;
  hbtrie *trie;
  btree_iterator *pbVar4;
  btree *btree;
  kvs_info *pkVar5;
  wal_iterator *pwVar6;
  long lVar7;
  fdb_status fVar8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar9;
  wal_item *pwVar10;
  long lVar11;
  ulong uVar12;
  ulong chunksize;
  uint64_t uVar13;
  void *buf;
  undefined8 uStack_100;
  ulong uStack_f8;
  wal_item wStack_f0;
  wal_item_header wStack_70;
  ulong uStack_38;
  
  if ((iterator == (fdb_iterator *)0x0) || (iterator->handle == (fdb_kvs_handle *)0x0)) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->hbtrie_iterator != (hbtrie_iterator *)0x0) {
    fVar8 = _fdb_iterator_seek_to_max_key(iterator);
    return fVar8;
  }
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  pfVar1 = iterator->handle;
  if (pfVar1 == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  iterator->direction = '\x02';
  uVar12 = (iterator->field_12).end_seqnum;
  iterator->_seqnum = uVar12;
  chunksize = (ulong)(pfVar1->config).chunksize;
  lVar11 = chunksize + 8;
  lVar7 = -(ulong)((int)lVar11 + 0xfU & 0xfffffff0);
  buf = (void *)((long)&uStack_f8 + lVar7);
  uVar12 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18
           | (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18
           | (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  uStack_38 = uVar12;
  if (pfVar1->kvs == (kvs_info *)0x0) {
    pbVar4 = iterator->seqtree_iterator;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1310ac;
    btree_iterator_free(pbVar4);
    pbVar4 = iterator->seqtree_iterator;
    btree = (iterator->handle->field_6).seqtree;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1310c0;
    btree_iterator_init(btree,pbVar4,&uStack_38);
  }
  else {
    fVar2 = pfVar1->kvs->id;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x13107c;
    kvid2buf(chunksize,fVar2,buf);
    *(ulong *)((long)buf + chunksize) = uVar12;
    phVar3 = iterator->seqtrie_iterator;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x131089;
    hbtrie_iterator_free(phVar3);
    phVar3 = iterator->seqtrie_iterator;
    trie = (iterator->handle->field_6).seqtrie;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1310a1;
    hbtrie_iterator_init(trie,phVar3,buf,0x10);
  }
  aVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)(iterator->field_12).end_seqnum;
  if (aVar9.end_seqnum == 0xffffffffffffffff) {
    pwVar6 = iterator->wal_itr;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x131100;
    pwVar10 = wal_itr_last(pwVar6);
  }
  else {
    pkVar5 = iterator->handle->kvs;
    if (pkVar5 == (kvs_info *)0x0) {
      wStack_70.key = (void *)0x0;
      lVar11 = 0;
    }
    else {
      fVar2 = pkVar5->id;
      wStack_70.key = buf;
      *(undefined8 *)((long)&uStack_100 + lVar7) = 0x1310e9;
      kvid2buf(chunksize,fVar2,buf);
      *(ulong *)((long)buf + chunksize) = uStack_38;
      aVar9 = iterator->field_12;
    }
    wStack_f0.header = &wStack_70;
    wStack_70.keylen = (uint16_t)lVar11;
    pwVar6 = iterator->wal_itr;
    wStack_f0.seqnum = aVar9.end_seqnum;
    *(undefined8 *)((long)&uStack_100 + lVar7) = 0x13112e;
    pwVar10 = wal_itr_search_smaller(pwVar6,&wStack_f0);
  }
  iterator->tree_cursor = pwVar10;
  uVar13 = 0xffffffffffffffff;
  if (pwVar10 == (wal_item *)0x0) {
LAB_00131166:
    pwVar10 = (wal_item *)0x0;
  }
  else {
    if ((pwVar10->seqnum == (iterator->field_12).end_seqnum) && ((iterator->opt & 8) != 0)) {
      pwVar6 = iterator->wal_itr;
      *(undefined8 *)((long)&uStack_100 + lVar7) = 0x131157;
      pwVar10 = wal_itr_prev(pwVar6);
      iterator->tree_cursor = pwVar10;
      if (pwVar10 == (wal_item *)0x0) goto LAB_00131166;
    }
    uVar13 = pwVar10->offset;
  }
  iterator->_offset = uVar13;
  iterator->tree_cursor_prev = pwVar10;
  *(undefined8 *)((long)&uStack_100 + lVar7) = 0x13117b;
  fVar8 = fdb_iterator_prev(iterator);
  return fVar8;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status ret;
    LATENCY_STAT_START();

    if (!iterator->hbtrie_iterator) {
        ret = _fdb_iterator_seek_to_max_seq(iterator);
    } else {
        ret = _fdb_iterator_seek_to_max_key(iterator);
    }
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEEK_MAX);
    return ret;
}